

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O1

stack_st_GENERAL_NAME * gnames_from_sectname(X509V3_CTX *ctx,char *sect)

{
  OPENSSL_STACK *nval;
  stack_st_GENERAL_NAME *psVar1;
  OPENSSL_STACK *sk;
  
  if (*sect == '@') {
    nval = (OPENSSL_STACK *)X509V3_get_section((X509V3_CTX *)ctx,sect + 1);
    sk = (OPENSSL_STACK *)0x0;
  }
  else {
    nval = (OPENSSL_STACK *)X509V3_parse_list(sect);
    sk = nval;
  }
  if (nval == (OPENSSL_STACK *)0x0) {
    ERR_put_error(0x14,0,0x99,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                  ,0x50);
    psVar1 = (stack_st_GENERAL_NAME *)0x0;
  }
  else {
    psVar1 = (stack_st_GENERAL_NAME *)
             v2i_GENERAL_NAMES((X509V3_EXT_METHOD *)0x0,(X509V3_CTX *)ctx,
                               (stack_st_CONF_VALUE *)nval);
    OPENSSL_sk_pop_free_ex(sk,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
  }
  return psVar1;
}

Assistant:

static STACK_OF(GENERAL_NAME) *gnames_from_sectname(const X509V3_CTX *ctx,
                                                    char *sect) {
  const STACK_OF(CONF_VALUE) *gnsect;
  STACK_OF(CONF_VALUE) *gnsect_owned = NULL;
  if (*sect == '@') {
    gnsect = X509V3_get_section(ctx, sect + 1);
  } else {
    gnsect_owned = X509V3_parse_list(sect);
    gnsect = gnsect_owned;
  }
  if (!gnsect) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_SECTION_NOT_FOUND);
    return NULL;
  }
  STACK_OF(GENERAL_NAME) *gens = v2i_GENERAL_NAMES(NULL, ctx, gnsect);
  sk_CONF_VALUE_pop_free(gnsect_owned, X509V3_conf_free);
  return gens;
}